

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O3

void __thiscall cppjieba::Trie::DeleteNode(Trie *this,TrieNode *node)

{
  _Hash_node_base *p_Var1;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  
  if (node == (TrieNode *)0x0) {
    return;
  }
  this_00 = &node->next->_M_h;
  if (this_00 ==
      (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)0x0) goto LAB_0010efe6;
  p_Var1 = (this_00->_M_before_begin)._M_nxt;
  if (p_Var1 == (_Hash_node_base *)0x0) {
LAB_0010efd0:
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(this_00);
  }
  else {
    do {
      DeleteNode(this,(TrieNode *)p_Var1[2]._M_nxt);
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
    this_00 = &node->next->_M_h;
    if (this_00 !=
        (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         *)0x0) goto LAB_0010efd0;
    this_00 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)0x0;
  }
  operator_delete(this_00);
LAB_0010efe6:
  operator_delete(node);
  return;
}

Assistant:

void DeleteNode(TrieNode* node) {
    if (NULL == node) {
      return;
    }
    if (NULL != node->next) {
      for (TrieNode::NextMap::iterator it = node->next->begin(); it != node->next->end(); ++it) {
        DeleteNode(it->second);
      }
      delete node->next;
    }
    delete node;
  }